

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

void swap_nodes(trie_node *a,trie_node *b)

{
  uint8_t uVar1;
  uint32_t uVar2;
  long lVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  trie_node *b_local;
  trie_node *a_local;
  trie_node tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (a->prefix).u.addr6.addr[3];
  uVar5 = *(undefined8 *)&a->prefix;
  uVar6 = *(undefined8 *)((long)&(a->prefix).u + 4);
  uVar1 = a->len;
  pvVar4 = a->data;
  (a->prefix).u.addr6.addr[3] = (b->prefix).u.addr6.addr[3];
  uVar7 = *(undefined8 *)((long)&(b->prefix).u + 4);
  *(undefined8 *)&a->prefix = *(undefined8 *)&b->prefix;
  *(undefined8 *)((long)&(a->prefix).u + 4) = uVar7;
  a->len = b->len;
  a->data = b->data;
  (b->prefix).u.addr6.addr[3] = uVar2;
  a_local._0_4_ = (lrtr_ip_version)uVar5;
  a_local._4_4_ = (uint32_t)((ulong)uVar5 >> 0x20);
  tmp.prefix.ver = (lrtr_ip_version)uVar6;
  tmp.prefix.u.addr6.addr[0] = (uint32_t)((ulong)uVar6 >> 0x20);
  (b->prefix).ver = (lrtr_ip_version)a_local;
  (b->prefix).u.addr6.addr[0] = a_local._4_4_;
  (b->prefix).u.addr6.addr[1] = tmp.prefix.ver;
  (b->prefix).u.addr6.addr[2] = (uint32_t)tmp.prefix.u.addr4.addr;
  b->len = uVar1;
  b->data = pvVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void swap_nodes(struct trie_node *a, struct trie_node *b)
{
	struct trie_node tmp;

	tmp.prefix = a->prefix;
	tmp.len = a->len;
	tmp.data = a->data;

	a->prefix = b->prefix;
	a->len = b->len;
	a->data = b->data;

	b->prefix = tmp.prefix;
	b->len = tmp.len;
	b->data = tmp.data;
}